

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O2

uint32_t helper_sve_pnext_aarch64(void *vd,void *vg,uint32_t pred_desc)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  uint32_t flags;
  intptr_t iVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t d;
  uint uVar7;
  uint uVar8;
  
  uVar8 = pred_desc & 0x1f;
  uVar7 = pred_desc >> 10 & 3;
  iVar4 = last_active_element((uint64_t *)vd,(ulong)uVar8,(ulong)uVar7);
  uVar5 = (1L << (sbyte)uVar7) + iVar4;
  uVar1 = pred_esz_masks_aarch64[uVar7];
  if ((long)uVar5 < (long)(ulong)(uVar8 << 6)) {
    bVar3 = (byte)uVar5;
    uVar5 = uVar5 & 0xffffffffffffffc0;
    uVar6 = -1L << (bVar3 & 0x3f);
    do {
      uVar6 = uVar6 & *(ulong *)((long)vg + ((long)uVar5 >> 3)) & uVar1;
      if (uVar6 != 0) {
        lVar2 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar5 = uVar5 + lVar2;
        break;
      }
      uVar5 = uVar5 + 0x40;
      uVar6 = 0xffffffffffffffff;
    } while ((long)uVar5 < (long)(ulong)(uVar8 << 6));
  }
  flags = 1;
  uVar6 = 0;
  do {
    d = 0;
    if ((long)uVar5 / 0x40 == uVar6) {
      d = 1L << ((byte)uVar5 & 0x3f);
    }
    *(uint64_t *)((long)vd + uVar6 * 8) = d;
    flags = iter_predtest_fwd(d,*(ulong *)((long)vg + uVar6 * 8) & uVar1,flags);
    uVar6 = uVar6 + 1;
  } while (uVar6 < uVar8);
  return flags;
}

Assistant:

uint32_t HELPER(sve_pnext)(void *vd, void *vg, uint32_t pred_desc)
{
    intptr_t words = extract32(pred_desc, 0, SIMD_OPRSZ_BITS);
    intptr_t esz = extract32(pred_desc, SIMD_DATA_SHIFT, 2);
    uint32_t flags = PREDTEST_INIT;
    uint64_t *d = vd, *g = vg, esz_mask;
    intptr_t i, next;

    next = last_active_element(vd, words, esz) + (1ULL << esz);
    esz_mask = pred_esz_masks[esz];

    /* Similar to the pseudocode for pnext, but scaled by ESZ
       so that we find the correct bit.  */
    if (next < words * 64) {
        uint64_t mask = -1;

        if (next & 63) {
            mask = ~((1ull << (next & 63)) - 1);
            next &= -64;
        }
        do {
            uint64_t this_g = g[next / 64] & esz_mask & mask;
            if (this_g != 0) {
                next = (next & -64) + ctz64(this_g);
                break;
            }
            next += 64;
            mask = -1;
        } while (next < words * 64);
    }

    i = 0;
    do {
        uint64_t this_d = 0;
        if (i == next / 64) {
            this_d = 1ull << (next & 63);
        }
        d[i] = this_d;
        flags = iter_predtest_fwd(this_d, g[i] & esz_mask, flags);
    } while (++i < words);

    return flags;
}